

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_sub(lua_State *L)

{
  char *pcVar1;
  lua_Integer pos;
  size_t sVar2;
  size_t sVar3;
  size_t end;
  size_t start;
  char *s;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar1 = luaL_checklstring(L,1,(size_t *)&s);
  pos = luaL_checkinteger((lua_State *)l,2);
  sVar2 = posrelatI(pos,(size_t)s);
  sVar3 = getendpos((lua_State *)l,3,-1,(size_t)s);
  if (sVar3 < sVar2) {
    lua_pushstring((lua_State *)l,"");
  }
  else {
    lua_pushlstring((lua_State *)l,pcVar1 + (sVar2 - 1),(sVar3 - sVar2) + 1);
  }
  return 1;
}

Assistant:

static int str_sub (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  size_t start = posrelatI(luaL_checkinteger(L, 2), l);
  size_t end = getendpos(L, 3, -1, l);
  if (start <= end)
    lua_pushlstring(L, s + start - 1, (end - start) + 1);
  else lua_pushliteral(L, "");
  return 1;
}